

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_query.c
# Opt level: O3

void ares_query_dnsrec_cb(void *arg,ares_status_t status,size_t timeouts,ares_dns_record_t *dnsrec)

{
  ares_dns_rcode_t rcode;
  ares_status_t aVar1;
  size_t ancount;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  uVar2 = CONCAT44(in_register_00000034,status);
  if (status == ARES_SUCCESS) {
    rcode = ares_dns_record_get_rcode(dnsrec);
    ancount = ares_dns_record_rr_cnt(dnsrec,ARES_SECTION_ANSWER);
    aVar1 = ares_dns_query_reply_tostatus(rcode,ancount);
    uVar2 = (ulong)aVar1;
  }
  (**arg)(*(undefined8 *)((long)arg + 8),uVar2,timeouts,dnsrec);
  ares_free(arg);
  return;
}

Assistant:

static void ares_query_dnsrec_cb(void *arg, ares_status_t status,
                                 size_t                   timeouts,
                                 const ares_dns_record_t *dnsrec)
{
  ares_query_dnsrec_arg_t *qquery = arg;

  if (status != ARES_SUCCESS) {
    qquery->callback(qquery->arg, status, timeouts, dnsrec);
  } else {
    size_t           ancount;
    ares_dns_rcode_t rcode;
    /* Pull the response code and answer count from the packet and convert any
     * errors.
     */
    rcode   = ares_dns_record_get_rcode(dnsrec);
    ancount = ares_dns_record_rr_cnt(dnsrec, ARES_SECTION_ANSWER);
    status  = ares_dns_query_reply_tostatus(rcode, ancount);
    qquery->callback(qquery->arg, status, timeouts, dnsrec);
  }
  ares_free(qquery);
}